

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  Value *pVVar5;
  undefined1 *puVar6;
  long *plVar7;
  int *piVar8;
  unsigned_long *puVar9;
  undefined8 *puVar10;
  size_t sVar11;
  char *__s;
  TValue num;
  BuffFS buff;
  Value local_118;
  char local_110 [8];
  BuffFS local_108;
  
  local_108.pushed = 0;
  local_108.blen = 0;
  local_108.L = L;
  pcVar4 = strchr(fmt,0x25);
  if (pcVar4 != (char *)0x0) {
    do {
      addstr2buff(&local_108,fmt,(long)pcVar4 - (long)fmt);
      bVar1 = pcVar4[1];
      if (bVar1 < 100) {
        if (bVar1 < 0x55) {
          if (bVar1 != 0x25) {
            if (bVar1 != 0x49) {
LAB_00148294:
              luaG_runerror(L,"invalid option \'%%%c\' to \'lua_pushfstring\'",
                            (ulong)(uint)(int)(char)bVar1);
            }
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              pVVar5 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              pVVar5 = (Value *)argp->overflow_arg_area;
              argp->overflow_arg_area = pVVar5 + 1;
            }
            local_118 = *pVVar5;
LAB_0014819c:
            local_110[0] = '\x03';
            goto LAB_001481c1;
          }
          sVar11 = 1;
          __s = "%";
        }
        else if (bVar1 == 0x55) {
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar9 = (unsigned_long *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            puVar9 = (unsigned_long *)argp->overflow_arg_area;
            argp->overflow_arg_area = puVar9 + 1;
          }
          iVar3 = luaO_utf8esc((char *)&local_118.i,*puVar9);
          sVar11 = (size_t)iVar3;
          __s = local_110 + -sVar11;
        }
        else {
          if (bVar1 != 99) goto LAB_00148294;
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar6 = (undefined1 *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            puVar6 = (undefined1 *)argp->overflow_arg_area;
            argp->overflow_arg_area = puVar6 + 8;
          }
          local_118.ub = *puVar6;
          sVar11 = 1;
          __s = (char *)&local_118;
        }
LAB_0014821a:
        addstr2buff(&local_108,__s,sVar11);
      }
      else if (bVar1 < 0x70) {
        if (bVar1 == 100) {
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            piVar8 = (int *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            piVar8 = (int *)argp->overflow_arg_area;
            argp->overflow_arg_area = piVar8 + 2;
          }
          local_118 = (Value)(long)*piVar8;
          goto LAB_0014819c;
        }
        if (bVar1 != 0x66) goto LAB_00148294;
        uVar2 = argp->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          pVVar5 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->fp_offset = uVar2 + 0x10;
        }
        else {
          pVVar5 = (Value *)argp->overflow_arg_area;
          argp->overflow_arg_area = pVVar5 + 1;
        }
        local_118 = *pVVar5;
        local_110[0] = '\x13';
LAB_001481c1:
        addnum2buff(&local_108,(TValue *)&local_118);
      }
      else {
        if (bVar1 != 0x70) {
          if (bVar1 != 0x73) goto LAB_00148294;
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            plVar7 = (long *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            plVar7 = (long *)argp->overflow_arg_area;
            argp->overflow_arg_area = plVar7 + 1;
          }
          __s = (char *)*plVar7;
          if (__s == (char *)0x0) {
            __s = "(null)";
          }
          sVar11 = strlen(__s);
          goto LAB_0014821a;
        }
        iVar3 = local_108.blen;
        if (0xa7 < (long)local_108.blen) {
          pushstr(&local_108,local_108.space,(long)local_108.blen);
          local_108._8_8_ = local_108._8_8_ & 0xffffffff;
          iVar3 = 0;
        }
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar10 = (undefined8 *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          puVar10 = (undefined8 *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar10 + 1;
        }
        iVar3 = snprintf(local_108.space + iVar3,0x20,"%p",*puVar10);
        local_108.blen = local_108.blen + iVar3;
      }
      fmt = pcVar4 + 2;
      pcVar4 = strchr(fmt,0x25);
    } while (pcVar4 != (char *)0x0);
  }
  sVar11 = strlen(fmt);
  addstr2buff(&local_108,fmt,sVar11);
  pushstr(&local_108,local_108.space,(long)local_108.blen);
  return (char *)(*(long *)((L->top).offset + -0x10) + 0x18);
}

Assistant:

const char *luaO_pushvfstring (lua_State *L, const char *fmt, va_list argp) {
  BuffFS buff;  /* holds last part of the result */
  const char *e;  /* points to next '%' */
  buff.pushed = buff.blen = 0;
  buff.L = L;
  while ((e = strchr(fmt, '%')) != NULL) {
    addstr2buff(&buff, fmt, e - fmt);  /* add 'fmt' up to '%' */
    switch (*(e + 1)) {  /* conversion specifier */
      case 's': {  /* zero-terminated string */
        const char *s = va_arg(argp, char *);
        if (s == NULL) s = "(null)";
        addstr2buff(&buff, s, strlen(s));
        break;
      }
      case 'c': {  /* an 'int' as a character */
        char c = cast_uchar(va_arg(argp, int));
        addstr2buff(&buff, &c, sizeof(char));
        break;
      }
      case 'd': {  /* an 'int' */
        TValue num;
        setivalue(&num, va_arg(argp, int));
        addnum2buff(&buff, &num);
        break;
      }
      case 'I': {  /* a 'lua_Integer' */
        TValue num;
        setivalue(&num, cast(lua_Integer, va_arg(argp, l_uacInt)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'f': {  /* a 'lua_Number' */
        TValue num;
        setfltvalue(&num, cast_num(va_arg(argp, l_uacNumber)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'p': {  /* a pointer */
        const int sz = 3 * sizeof(void*) + 8; /* enough space for '%p' */
        char *bf = getbuff(&buff, sz);
        void *p = va_arg(argp, void *);
        int len = lua_pointer2str(bf, sz, p);
        addsize(&buff, len);
        break;
      }
      case 'U': {  /* a 'long' as a UTF-8 sequence */
        char bf[UTF8BUFFSZ];
        int len = luaO_utf8esc(bf, va_arg(argp, long));
        addstr2buff(&buff, bf + UTF8BUFFSZ - len, len);
        break;
      }
      case '%': {
        addstr2buff(&buff, "%", 1);
        break;
      }
      default: {
        luaG_runerror(L, "invalid option '%%%c' to 'lua_pushfstring'",
                         *(e + 1));
      }
    }
    fmt = e + 2;  /* skip '%' and the specifier */
  }
  addstr2buff(&buff, fmt, strlen(fmt));  /* rest of 'fmt' */
  clearbuff(&buff);  /* empty buffer into the stack */
  lua_assert(buff.pushed == 1);
  return getstr(tsvalue(s2v(L->top.p - 1)));
}